

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_rect nk_recti(int x,int y,int w,int h)

{
  nk_rect nVar1;
  
  nVar1.x = (float)x;
  nVar1.y = (float)y;
  nVar1.w = (float)w;
  nVar1.h = (float)h;
  return nVar1;
}

Assistant:

NK_API struct nk_rect
nk_recti(int x, int y, int w, int h)
{
    struct nk_rect r;
    r.x = (float)x;
    r.y = (float)y;
    r.w = (float)w;
    r.h = (float)h;
    return r;
}